

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O0

void test_symbol(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined8 uVar5;
  char **ppcVar6;
  bson_t *bcon;
  char *val;
  
  uVar3 = bson_bcon_magic();
  pcVar4 = bcon_ensure_const_char_ptr("symbol");
  uVar3 = bcon_new(0,"foo",uVar3,0xd,pcVar4);
  uVar5 = bson_bcone_magic();
  ppcVar6 = bcon_ensure_const_char_ptr_ptr((char **)&bcon);
  bVar1 = bcon_extract(uVar3,"foo",uVar5,0xd,ppcVar6,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xc9,"test_symbol","BCON_EXTRACT (bcon, \"foo\", BCONE_SYMBOL (val))");
    abort();
  }
  iVar2 = strcmp((char *)bcon,"symbol");
  if (iVar2 != 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
            ,0xcb,"test_symbol","strcmp (val, \"symbol\") == 0");
    abort();
  }
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_symbol (void)
{
   bson_t bcon, expected;

   bson_init (&bcon);
   bson_init (&expected);

   bson_append_symbol (&expected, "foo", -1, "deadbeef", -1);

   BCON_APPEND (&bcon, "foo", BCON_SYMBOL ("deadbeef"));

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
}